

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O2

void amrex::anon_unknown_12::read_file
               (char *fname,
               list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *tab)

{
  _Iter_pred<amrex::(anonymous_namespace)::read_file(char_const*,std::__cxx11::list<amrex::ParmParse::PP_entry,std::allocator<amrex::ParmParse::PP_entry>>&)::__0>
  *p_Var1;
  bool bVar2;
  istream *piVar3;
  ulong *puVar4;
  ostream *poVar5;
  ulong uVar6;
  _Iter_pred<amrex::(anonymous_namespace)::read_file(char_const*,std::__cxx11::list<amrex::ParmParse::PP_entry,std::allocator<amrex::ParmParse::PP_entry>>&)::__0>
  *p_Var7;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __it;
  char cVar8;
  long lVar9;
  _Alloc_hider this;
  size_type sVar10;
  bool bVar11;
  reference rVar12;
  _Bit_iterator _Var13;
  vector<bool,_std::allocator<bool>_> valid_region;
  string filestring_cxx;
  Vector<char,_std::allocator<char>_> fileCharPtr;
  string local_5b0 [32];
  vector<bool,_std::allocator<bool>_> has_true;
  char *b;
  pointer psStack_560;
  pointer local_558;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_550;
  regex endif_regex;
  regex else_regex;
  regex elif_regex;
  regex if_regex;
  string filename;
  ostringstream os_cxx;
  ostringstream os_fortran;
  istringstream is;
  
  if ((fname != (char *)0x0) && (*fname != '\0')) {
    fileCharPtr.super_vector<char,_std::allocator<char>_>.
    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    fileCharPtr.super_vector<char,_std::allocator<char>_>.
    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    fileCharPtr.super_vector<char,_std::allocator<char>_>.
    super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&filename,fname,(allocator *)&is);
    _is = ParallelDescriptor::m_comm;
    ParallelDescriptor::ReadAndBcastFile(&filename,&fileCharPtr,true,(MPI_Comm *)&is);
    std::__cxx11::string::string
              ((string *)&os_cxx,
               fileCharPtr.super_vector<char,_std::allocator<char>_>.
               super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start,(allocator *)&os_fortran);
    std::__cxx11::istringstream::istringstream((istringstream *)&is,(string *)&os_cxx,_S_in);
    std::__cxx11::string::~string((string *)&os_cxx);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&os_cxx,_S_out);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&os_fortran,_S_out);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&if_regex,
               "^\\s*#\\s*if\\s+\\(?\\s*AMREX_SPACEDIM\\s*(>|<|==|>=|<=)\\s*([1-3])\\s*\\)?\\s*$",
               0x10);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&elif_regex,
               "^\\s*#\\s*elif\\s+\\(?\\s*AMREX_SPACEDIM\\s*(>|<|==|>=|<=)\\s*([1-3])\\s*\\)?\\s*$",
               0x10);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&else_regex,"^\\s*#\\s*else\\s*$",0x10);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&endif_regex,"^\\s*#\\s*endif\\s*$",0x10);
    valid_region.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    valid_region.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = 0;
    valid_region.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    valid_region.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_offset = 0;
    valid_region.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
    has_true.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    has_true.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    has_true.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    has_true.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    has_true.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
    filestring_cxx._M_dataplus._M_p = (pointer)&filestring_cxx.field_2;
    filestring_cxx._M_string_length = 0;
    filestring_cxx.field_2._M_local_buf[0] = '\0';
    bVar11 = false;
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&is,(string *)&filestring_cxx);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      local_558 = (pointer)0x0;
      _Stack_550._M_current = (char *)0x0;
      b = (char *)0x0;
      psStack_560 = (pointer)0x0;
      bVar2 = std::
              regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                        (&filestring_cxx,(smatch *)&b,&if_regex,0);
      if (bVar2) {
        bVar2 = anon_unknown_0::isTrue((smatch *)&b);
        std::vector<bool,_std::allocator<bool>_>::push_back(&valid_region,bVar2);
        std::vector<bool,_std::allocator<bool>_>::push_back(&has_true,bVar2);
        goto LAB_004de210;
      }
      bVar2 = std::
              regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                        (&filestring_cxx,(smatch *)&b,&elif_regex,0);
      if (bVar2) {
        rVar12 = std::vector<bool,_std::allocator<bool>_>::back(&has_true);
        if ((*rVar12._M_p & rVar12._M_mask) == 0) {
          bVar2 = anon_unknown_0::isTrue((smatch *)&b);
          rVar12 = std::vector<bool,_std::allocator<bool>_>::back(&valid_region);
          puVar4 = rVar12._M_p;
          if (bVar2) {
            uVar6 = rVar12._M_mask | *puVar4;
          }
          else {
            uVar6 = ~rVar12._M_mask & *puVar4;
          }
          *puVar4 = uVar6;
          rVar12 = std::vector<bool,_std::allocator<bool>_>::back(&has_true);
          if (bVar2) {
LAB_004de205:
            *rVar12._M_p = *rVar12._M_p | rVar12._M_mask;
            goto LAB_004de210;
          }
        }
        else {
          rVar12 = std::vector<bool,_std::allocator<bool>_>::back(&valid_region);
        }
LAB_004de20a:
        *rVar12._M_p = *rVar12._M_p & ~rVar12._M_mask;
      }
      else {
        bVar2 = std::
                regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                          (&filestring_cxx,(smatch *)&b,&else_regex,0);
        if (bVar2) {
          rVar12 = std::vector<bool,_std::allocator<bool>_>::back(&has_true);
          if ((*rVar12._M_p & rVar12._M_mask) == 0) {
            rVar12 = std::vector<bool,_std::allocator<bool>_>::back(&valid_region);
            goto LAB_004de205;
          }
          rVar12 = std::vector<bool,_std::allocator<bool>_>::back(&valid_region);
          goto LAB_004de20a;
        }
        bVar2 = std::
                regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                          (&filestring_cxx,(smatch *)&b,&endif_regex,0);
        if (bVar2) {
          bVar2 = valid_region.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0;
          valid_region.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset =
               valid_region.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset - 1;
          if (bVar2) {
            valid_region.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
            ._M_finish.super__Bit_iterator_base._M_offset = 0x3f;
            valid_region.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
            ._M_finish.super__Bit_iterator_base._M_p =
                 valid_region.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p + -1;
          }
          bVar2 = has_true.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0;
          has_true.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset =
               has_true.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_finish.super__Bit_iterator_base._M_offset - 1;
          if (bVar2) {
            has_true.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_offset = 0x3f;
            has_true.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_p =
                 has_true.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p + -1;
          }
        }
        else {
          local_5b0[0] = (string)0x0;
          __it._M_current = (char *)0x0;
          _Var13 = std::__find_if<std::_Bit_iterator,__gnu_cxx::__ops::_Iter_equals_val<bool_const>>
                             (valid_region.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,0,
                              valid_region.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p,
                              valid_region.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset,
                              local_5b0);
          if ((_Var13.super__Bit_iterator_base._M_p ==
               valid_region.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) &&
             (_Var13.super__Bit_iterator_base._M_offset ==
              valid_region.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset)) {
            p_Var1 = (_Iter_pred<amrex::(anonymous_namespace)::read_file(char_const*,std::__cxx11::list<amrex::ParmParse::PP_entry,std::allocator<amrex::ParmParse::PP_entry>>&)::__0>
                      *)(filestring_cxx._M_dataplus._M_p + filestring_cxx._M_string_length);
            this = filestring_cxx._M_dataplus;
            sVar10 = filestring_cxx._M_string_length;
            for (lVar9 = (long)filestring_cxx._M_string_length >> 2; 0 < lVar9; lVar9 = lVar9 + -1)
            {
              bVar2 = __gnu_cxx::__ops::
                      _Iter_pred<amrex::(anonymous_namespace)::read_file(char_const*,std::__cxx11::list<amrex::ParmParse::PP_entry,std::allocator<amrex::ParmParse::PP_entry>>&)::$_0>
                      ::operator()((_Iter_pred<amrex::(anonymous_namespace)::read_file(char_const*,std::__cxx11::list<amrex::ParmParse::PP_entry,std::allocator<amrex::ParmParse::PP_entry>>&)::__0>
                                    *)this._M_p,__it);
              p_Var7 = (_Iter_pred<amrex::(anonymous_namespace)::read_file(char_const*,std::__cxx11::list<amrex::ParmParse::PP_entry,std::allocator<amrex::ParmParse::PP_entry>>&)::__0>
                        *)this._M_p;
              if (bVar2) goto LAB_004de26b;
              bVar2 = __gnu_cxx::__ops::
                      _Iter_pred<amrex::(anonymous_namespace)::read_file(char_const*,std::__cxx11::list<amrex::ParmParse::PP_entry,std::allocator<amrex::ParmParse::PP_entry>>&)::$_0>
                      ::operator()((_Iter_pred<amrex::(anonymous_namespace)::read_file(char_const*,std::__cxx11::list<amrex::ParmParse::PP_entry,std::allocator<amrex::ParmParse::PP_entry>>&)::__0>
                                    *)this._M_p + 1,__it);
              p_Var7 = (_Iter_pred<amrex::(anonymous_namespace)::read_file(char_const*,std::__cxx11::list<amrex::ParmParse::PP_entry,std::allocator<amrex::ParmParse::PP_entry>>&)::__0>
                        *)this._M_p + 1;
              if (bVar2) goto LAB_004de26b;
              bVar2 = __gnu_cxx::__ops::
                      _Iter_pred<amrex::(anonymous_namespace)::read_file(char_const*,std::__cxx11::list<amrex::ParmParse::PP_entry,std::allocator<amrex::ParmParse::PP_entry>>&)::$_0>
                      ::operator()((_Iter_pred<amrex::(anonymous_namespace)::read_file(char_const*,std::__cxx11::list<amrex::ParmParse::PP_entry,std::allocator<amrex::ParmParse::PP_entry>>&)::__0>
                                    *)this._M_p + 2,__it);
              p_Var7 = (_Iter_pred<amrex::(anonymous_namespace)::read_file(char_const*,std::__cxx11::list<amrex::ParmParse::PP_entry,std::allocator<amrex::ParmParse::PP_entry>>&)::__0>
                        *)this._M_p + 2;
              if (bVar2) goto LAB_004de26b;
              bVar2 = __gnu_cxx::__ops::
                      _Iter_pred<amrex::(anonymous_namespace)::read_file(char_const*,std::__cxx11::list<amrex::ParmParse::PP_entry,std::allocator<amrex::ParmParse::PP_entry>>&)::$_0>
                      ::operator()((_Iter_pred<amrex::(anonymous_namespace)::read_file(char_const*,std::__cxx11::list<amrex::ParmParse::PP_entry,std::allocator<amrex::ParmParse::PP_entry>>&)::__0>
                                    *)this._M_p + 3,__it);
              p_Var7 = (_Iter_pred<amrex::(anonymous_namespace)::read_file(char_const*,std::__cxx11::list<amrex::ParmParse::PP_entry,std::allocator<amrex::ParmParse::PP_entry>>&)::__0>
                        *)this._M_p + 3;
              if (bVar2) goto LAB_004de26b;
              this._M_p = this._M_p + 4;
              sVar10 = sVar10 - 4;
            }
            if (sVar10 == 1) {
LAB_004de399:
              bVar2 = __gnu_cxx::__ops::
                      _Iter_pred<amrex::(anonymous_namespace)::read_file(char_const*,std::__cxx11::list<amrex::ParmParse::PP_entry,std::allocator<amrex::ParmParse::PP_entry>>&)::$_0>
                      ::operator()((_Iter_pred<amrex::(anonymous_namespace)::read_file(char_const*,std::__cxx11::list<amrex::ParmParse::PP_entry,std::allocator<amrex::ParmParse::PP_entry>>&)::__0>
                                    *)this._M_p,__it);
              p_Var7 = (_Iter_pred<amrex::(anonymous_namespace)::read_file(char_const*,std::__cxx11::list<amrex::ParmParse::PP_entry,std::allocator<amrex::ParmParse::PP_entry>>&)::__0>
                        *)this._M_p;
              if (!bVar2) {
                p_Var7 = p_Var1;
              }
            }
            else if (sVar10 == 2) {
LAB_004de37e:
              bVar2 = __gnu_cxx::__ops::
                      _Iter_pred<amrex::(anonymous_namespace)::read_file(char_const*,std::__cxx11::list<amrex::ParmParse::PP_entry,std::allocator<amrex::ParmParse::PP_entry>>&)::$_0>
                      ::operator()((_Iter_pred<amrex::(anonymous_namespace)::read_file(char_const*,std::__cxx11::list<amrex::ParmParse::PP_entry,std::allocator<amrex::ParmParse::PP_entry>>&)::__0>
                                    *)this._M_p,__it);
              p_Var7 = (_Iter_pred<amrex::(anonymous_namespace)::read_file(char_const*,std::__cxx11::list<amrex::ParmParse::PP_entry,std::allocator<amrex::ParmParse::PP_entry>>&)::__0>
                        *)this._M_p;
              if (!bVar2) {
                this._M_p = this._M_p + 1;
                goto LAB_004de399;
              }
            }
            else {
              p_Var7 = p_Var1;
              if ((sVar10 == 3) &&
                 (bVar2 = __gnu_cxx::__ops::
                          _Iter_pred<amrex::(anonymous_namespace)::read_file(char_const*,std::__cxx11::list<amrex::ParmParse::PP_entry,std::allocator<amrex::ParmParse::PP_entry>>&)::$_0>
                          ::operator()((_Iter_pred<amrex::(anonymous_namespace)::read_file(char_const*,std::__cxx11::list<amrex::ParmParse::PP_entry,std::allocator<amrex::ParmParse::PP_entry>>&)::__0>
                                        *)this._M_p,__it),
                 p_Var7 = (_Iter_pred<amrex::(anonymous_namespace)::read_file(char_const*,std::__cxx11::list<amrex::ParmParse::PP_entry,std::allocator<amrex::ParmParse::PP_entry>>&)::__0>
                           *)this._M_p, !bVar2)) {
                this._M_p = this._M_p + 1;
                goto LAB_004de37e;
              }
            }
LAB_004de26b:
            cVar8 = (char)&filestring_cxx;
            if (bVar11) {
              std::__cxx11::string::find(cVar8,0x21);
              std::__cxx11::string::substr((ulong)local_5b0,(ulong)&filestring_cxx);
              poVar5 = std::operator<<((ostream *)&os_fortran,local_5b0);
              std::operator<<(poVar5," ");
              std::__cxx11::string::~string(local_5b0);
              if (p_Var7 == (_Iter_pred<amrex::(anonymous_namespace)::read_file(char_const*,std::__cxx11::list<amrex::ParmParse::PP_entry,std::allocator<amrex::ParmParse::PP_entry>>&)::__0>
                             *)(filestring_cxx._M_dataplus._M_p + filestring_cxx._M_string_length))
              {
LAB_004de34a:
                bVar11 = true;
              }
              else {
                bVar11 = *p_Var7 !=
                         (_Iter_pred<amrex::(anonymous_namespace)::read_file(char_const*,std::__cxx11::list<amrex::ParmParse::PP_entry,std::allocator<amrex::ParmParse::PP_entry>>&)::__0>
                          )0x2f;
              }
            }
            else {
              if ((p_Var7 != p_Var1) &&
                 (*p_Var7 ==
                  (_Iter_pred<amrex::(anonymous_namespace)::read_file(char_const*,std::__cxx11::list<amrex::ParmParse::PP_entry,std::allocator<amrex::ParmParse::PP_entry>>&)::__0>
                   )0x26)) {
                std::__cxx11::string::find(cVar8,0x21);
                std::__cxx11::string::substr((ulong)local_5b0,(ulong)&filestring_cxx);
                poVar5 = std::operator<<((ostream *)&os_fortran,local_5b0);
                std::operator<<(poVar5," ");
                std::__cxx11::string::~string(local_5b0);
                goto LAB_004de34a;
              }
              poVar5 = std::operator<<((ostream *)&os_cxx,(string *)&filestring_cxx);
              std::operator<<(poVar5,"\n");
              bVar11 = false;
            }
          }
        }
      }
LAB_004de210:
      std::
      _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)&b);
    }
    std::__cxx11::string::~string((string *)&filestring_cxx);
    std::__cxx11::stringbuf::str();
    b = filestring_cxx._M_dataplus._M_p;
    bldTable(&b,tab);
    std::__cxx11::string::~string((string *)&filestring_cxx);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              (&has_true.super__Bvector_base<std::allocator<bool>_>);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              (&valid_region.super__Bvector_base<std::allocator<bool>_>);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&endif_regex);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&else_regex);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&elif_regex);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&if_regex);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os_fortran);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os_cxx);
    std::__cxx11::istringstream::~istringstream((istringstream *)&is);
    std::__cxx11::string::~string((string *)&filename);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)&fileCharPtr);
  }
  return;
}

Assistant:

static void
read_file (const char*                     fname,
           std::list<ParmParse::PP_entry>& tab)
{
    //
    // Space for input file if it exists.
    //
    if ( fname != 0 && fname[0] != 0 )
    {
        Vector<char> fileCharPtr;
        std::string filename = fname;
        ParallelDescriptor::ReadAndBcastFile(filename, fileCharPtr);

        std::istringstream is(fileCharPtr.data());
        std::ostringstream os_cxx(std::ios_base::out);
        std::ostringstream os_fortran(std::ios_base::out);
        bool fortran_namelist = false;
        std::regex if_regex("^\\s*#\\s*if\\s+\\(?\\s*AMREX_SPACEDIM\\s*(>|<|==|>=|<=)\\s*([1-3])\\s*\\)?\\s*$");
        std::regex elif_regex("^\\s*#\\s*elif\\s+\\(?\\s*AMREX_SPACEDIM\\s*(>|<|==|>=|<=)\\s*([1-3])\\s*\\)?\\s*$");
        std::regex else_regex("^\\s*#\\s*else\\s*$");
        std::regex endif_regex("^\\s*#\\s*endif\\s*$");
        std::vector<bool> valid_region;  // Keep this block or not?
        std::vector<bool> has_true;      // Has previous if/elif ever been true?
        for (std::string line; std::getline(is, line); ) {
            std::smatch sm;
            if (std::regex_match(line, sm, if_regex)) {
                bool r = isTrue(sm);
                valid_region.push_back(r);
                has_true.push_back(r);
                continue;
            } else if (std::regex_match(line, sm, elif_regex)) {
                if (has_true.back() == false) {
                    // If none of the previous if/elif is true
                    bool r = isTrue(sm);
                    valid_region.back() = r;
                    has_true.back() = r;
                } else {
                    // If any of the previous if/elif is true
                    valid_region.back() = false;
                }
                continue;
            } else if (std::regex_match(line, sm, else_regex)) {
                if (has_true.back() == false) {
                    // If none of the previous if/elif is true,
                    valid_region.back() = true;
                } else {
                    valid_region.back() = false;
                }
                continue;
            } else if (std::regex_match(line, sm, endif_regex)) {
                valid_region.pop_back();
                has_true.pop_back();
                continue;
            }

            if (std::find(std::begin(valid_region), std::end(valid_region), false)
                != std::end(valid_region)) {
                continue;
            }

            auto r = std::find_if(std::begin(line), std::end(line),
                                  [](int c) -> bool { return !std::isspace(c); });
            if (fortran_namelist) { // already inside fortran namelist
                // os_fortran << line << "\n";
                // pgi and ibm do not like `\n`.  We strip comments for them too.
                os_fortran << line.substr(0, line.find('!')) << " ";
                if (r != std::end(line) && *r == '/') {
                    fortran_namelist = false; // end of Fortran namelist
                }
            } else if (r != std::end(line) && *r == '&') {
                // os_fortran << line << "\n";
                // pgi and ibm do not like `\n`.  We strip comments for them too.
                os_fortran << line.substr(0, line.find('!')) << " ";
                fortran_namelist = true;  // begin of Fortran namelist
            } else {
                os_cxx << line << "\n";
            }
        }

        std::string filestring_cxx = os_cxx.str();
        const char* b = filestring_cxx.c_str();
        bldTable(b, tab);

#if !defined(BL_NO_FORT)
        std::string filestring_fortran = os_fortran.str();
        amrex_init_namelist(filestring_fortran.c_str());
#endif
    }
}